

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O1

void initialise_wcurve(ec_curve *curve,mp_int *p,mp_int *a,mp_int *b,mp_int *nonsquare,mp_int *G_x,
                      mp_int *G_y,mp_int *G_order)

{
  mp_int *pmVar1;
  size_t sVar2;
  WeierstrassCurve *wc;
  WeierstrassPoint *pWVar3;
  
  curve->type = EC_WEIERSTRASS;
  pmVar1 = mp_copy(p);
  curve->p = pmVar1;
  sVar2 = mp_get_nbits(p);
  curve->fieldBits = sVar2;
  curve->fieldBytes = sVar2 + 7 >> 3;
  wc = ecc_weierstrass_curve(p,a,b,nonsquare);
  (curve->field_6).w.wc = wc;
  pWVar3 = ecc_weierstrass_point_new(wc,G_x,G_y);
  (curve->field_6).w.G = pWVar3;
  pmVar1 = mp_copy(G_order);
  (curve->field_6).w.G_order = pmVar1;
  return;
}

Assistant:

static void initialise_wcurve(
    struct ec_curve *curve, mp_int *p, mp_int *a, mp_int *b,
    mp_int *nonsquare, mp_int *G_x, mp_int *G_y, mp_int *G_order)
{
    initialise_common(curve, EC_WEIERSTRASS, p, 0);

    curve->w.wc = ecc_weierstrass_curve(p, a, b, nonsquare);

    curve->w.G = ecc_weierstrass_point_new(curve->w.wc, G_x, G_y);
    curve->w.G_order = mp_copy(G_order);
}